

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphicsAccessories.cpp
# Opt level: O1

RENDER_DEVICE_TYPE Diligent::ArchiveDataFlagToRenderDeviceType(ARCHIVE_DEVICE_DATA_FLAGS Flag)

{
  ARCHIVE_DEVICE_DATA_FLAGS AVar1;
  string msg;
  string local_38;
  
  AVar1 = Flag - ARCHIVE_DEVICE_DATA_FLAG_D3D11;
  if ((Flag ^ AVar1) <= AVar1) {
    FormatString<char[29]>(&local_38,(char (*) [29])"Exactly one flag is expected");
    DebugAssertionFailed
              (local_38._M_dataplus._M_p,"ArchiveDataFlagToRenderDeviceType",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsAccessories/src/GraphicsAccessories.cpp"
               ,0x791);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p != &local_38.field_2) {
      operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
    }
  }
  if ((int)Flag < 0x10) {
    if (AVar1 < ARCHIVE_DEVICE_DATA_FLAG_D3D12) {
      return Flag;
    }
    if (Flag == ARCHIVE_DEVICE_DATA_FLAG_GL) {
      return RENDER_DEVICE_TYPE_GL;
    }
    if (Flag == ARCHIVE_DEVICE_DATA_FLAG_GLES) {
      return RENDER_DEVICE_TYPE_GLES;
    }
  }
  else if ((int)Flag < 0x40) {
    if (Flag == ARCHIVE_DEVICE_DATA_FLAG_VULKAN) {
      return RENDER_DEVICE_TYPE_VULKAN;
    }
    if (Flag == ARCHIVE_DEVICE_DATA_FLAG_METAL_MACOS) {
      return RENDER_DEVICE_TYPE_METAL;
    }
  }
  else {
    if (Flag == ARCHIVE_DEVICE_DATA_FLAG_METAL_IOS) {
      return RENDER_DEVICE_TYPE_METAL;
    }
    if (Flag == ARCHIVE_DEVICE_DATA_FLAG_LAST) {
      return RENDER_DEVICE_TYPE_WEBGPU;
    }
  }
  FormatString<char[36]>(&local_38,(char (*) [36])"Unexpected archive device data flag");
  DebugAssertionFailed
            (local_38._M_dataplus._M_p,"ArchiveDataFlagToRenderDeviceType",
             "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsAccessories/src/GraphicsAccessories.cpp"
             ,0x7ab);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  return RENDER_DEVICE_TYPE_UNDEFINED;
}

Assistant:

RENDER_DEVICE_TYPE ArchiveDataFlagToRenderDeviceType(ARCHIVE_DEVICE_DATA_FLAGS Flag)
{
    VERIFY(IsPowerOfTwo(Flag), "Exactly one flag is expected");
    switch (Flag)
    {
        case ARCHIVE_DEVICE_DATA_FLAG_D3D11:
            return RENDER_DEVICE_TYPE_D3D11;

        case ARCHIVE_DEVICE_DATA_FLAG_D3D12:
            return RENDER_DEVICE_TYPE_D3D12;

        case ARCHIVE_DEVICE_DATA_FLAG_GL:
            return RENDER_DEVICE_TYPE_GL;

        case ARCHIVE_DEVICE_DATA_FLAG_GLES:
            return RENDER_DEVICE_TYPE_GLES;

        case ARCHIVE_DEVICE_DATA_FLAG_VULKAN:
            return RENDER_DEVICE_TYPE_VULKAN;

        case ARCHIVE_DEVICE_DATA_FLAG_METAL_MACOS:
        case ARCHIVE_DEVICE_DATA_FLAG_METAL_IOS:
            return RENDER_DEVICE_TYPE_METAL;

        case ARCHIVE_DEVICE_DATA_FLAG_WEBGPU:
            return RENDER_DEVICE_TYPE_WEBGPU;

        default:
            UNEXPECTED("Unexpected archive device data flag");
            return RENDER_DEVICE_TYPE_UNDEFINED;
    }
}